

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeWebAssemblyMemoryPrototype
               (DynamicObject *prototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  undefined8 in_RAX;
  uint uVar4;
  StaticType *type;
  LiteralString *pLVar1;
  JavascriptMethod entryPoint;
  RuntimeFunction *pRVar2;
  RuntimeFunction *pRVar3;
  ulong uVar5;
  
  uVar4 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,prototype,mode,4,0);
  this = (((prototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar5 = (ulong)uVar4 << 0x20;
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (prototype,0x67,(this->webAssemblyMemoryConstructor).ptr,6,0,0,uVar5);
  if (((this_00->config).threadConfig)->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&this->stringCache);
    pLVar1 = LiteralString::New(type,L"WebAssembly.Memory",0x12,this->recycler);
    uVar5 = uVar5 & 0xffffffff00000000;
    (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(prototype,0x1b,pLVar1,2,0,0,uVar5);
  }
  entryPoint = FunctionInfo::GetOriginalEntryPoint
                         ((FunctionInfo *)WebAssemblyMemory::EntryInfo::Grow);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssemblyMemory::EntryInfo::Grow,1,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0xe4);
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(prototype,0xe4,pRVar2,6,0,0,uVar5 & 0xffffffff00000000);
  ScriptContext::SetBuiltInLibraryFunction(this_00,entryPoint,&pRVar2->super_JavascriptFunction);
  pRVar3 = CreateGetterFunction
                     (this,0x1aa,(FunctionInfo *)WebAssemblyMemory::EntryInfo::GetterBuffer);
  pRVar2 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  if (pRVar3 == (RuntimeFunction *)0x0) {
    pRVar3 = pRVar2;
  }
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x2d])(prototype,0x1aa,pRVar3,pRVar2,0);
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x3e])(prototype,0x1aa,6);
  DynamicObject::SetHasNoEnumerableProperties(prototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyMemoryPrototype(DynamicObject* prototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(prototype, mode, 4);

        JavascriptLibrary* library = prototype->GetLibrary();
        ScriptContext* scriptContext = prototype->GetScriptContext();

        library->AddMember(prototype, PropertyIds::constructor, library->webAssemblyMemoryConstructor);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(prototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WebAssembly.Memory")), PropertyConfigurable);
        }
        scriptContext->SetBuiltInLibraryFunction(WebAssemblyMemory::EntryInfo::Grow.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(prototype, PropertyIds::grow, &WebAssemblyMemory::EntryInfo::Grow, 1));

        library->AddAccessorsToLibraryObject(prototype, PropertyIds::buffer, &WebAssemblyMemory::EntryInfo::GetterBuffer, nullptr);

        prototype->SetHasNoEnumerableProperties(true);

        return true;
    }